

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_output_basic(connectdata *conn,_Bool proxy)

{
  SessionHandle *data_00;
  size_t insize;
  char *pcVar1;
  char *pcStack_50;
  CURLcode result;
  char *pwd;
  char *user;
  char **userp;
  SessionHandle *data;
  char *authorization;
  size_t size;
  connectdata *pcStack_18;
  _Bool proxy_local;
  connectdata *conn_local;
  
  authorization = (char *)0x0;
  data = (SessionHandle *)0x0;
  data_00 = conn->data;
  if (proxy) {
    user = (char *)&conn->allocptr;
    pwd = conn->proxyuser;
    pcStack_50 = conn->proxypasswd;
  }
  else {
    user = (char *)&(conn->allocptr).userpwd;
    pwd = conn->user;
    pcStack_50 = conn->passwd;
  }
  size._7_1_ = proxy;
  pcStack_18 = conn;
  curl_msnprintf((data_00->state).buffer,0x4001,"%s:%s",pwd,pcStack_50);
  insize = strlen((data_00->state).buffer);
  conn_local._4_4_ =
       Curl_base64_encode(data_00,(data_00->state).buffer,insize,(char **)&data,
                          (size_t *)&authorization);
  if (conn_local._4_4_ == CURLE_OK) {
    if (data == (SessionHandle *)0x0) {
      conn_local._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
    }
    else {
      (*Curl_cfree)(*(void **)user);
      pcVar1 = "";
      if ((size._7_1_ & 1) != 0) {
        pcVar1 = "Proxy-";
      }
      pcVar1 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar1,data);
      *(char **)user = pcVar1;
      (*Curl_cfree)(data);
      if (*(long *)user == 0) {
        conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode http_output_basic(struct connectdata *conn, bool proxy)
{
  size_t size = 0;
  char *authorization = NULL;
  struct SessionHandle *data = conn->data;
  char **userp;
  const char *user;
  const char *pwd;
  CURLcode result;

  if(proxy) {
    userp = &conn->allocptr.proxyuserpwd;
    user = conn->proxyuser;
    pwd = conn->proxypasswd;
  }
  else {
    userp = &conn->allocptr.userpwd;
    user = conn->user;
    pwd = conn->passwd;
  }

  snprintf(data->state.buffer, sizeof(data->state.buffer), "%s:%s", user, pwd);

  result = Curl_base64_encode(data,
                              data->state.buffer, strlen(data->state.buffer),
                              &authorization, &size);
  if(result)
    return result;

  if(!authorization)
    return CURLE_REMOTE_ACCESS_DENIED;

  free(*userp);
  *userp = aprintf("%sAuthorization: Basic %s\r\n",
                   proxy?"Proxy-":"",
                   authorization);
  free(authorization);
  if(!*userp)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}